

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O2

void mf_repdata_do_replace(MF_REPLACEMENT_DATA_t *rd,size_t to_position)

{
  ulong uVar1;
  mf_replacement_nominee *pmVar2;
  ulong to;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = rd->trie->base_position;
  if (uVar1 <= to_position) {
    uVar3 = rd->noms_size;
    if (uVar3 != 0) {
      for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < uVar3; uVar5 = uVar5 + 1) {
        pmVar2 = rd->noms;
        to = pmVar2[uVar6].position - ((pmVar2[uVar6].pattern)->ptext).length;
        if (to_position <= to) break;
        mf_repdata_appendfactor(rd,rd->curser,to);
        mf_repdata_appendtext(rd,&(pmVar2[uVar6].pattern)->rtext);
        rd->curser = pmVar2[uVar6].position;
        uVar3 = rd->noms_size;
      }
      sVar4 = uVar3 - uVar6;
      rd->noms_size = sVar4;
      if (uVar6 != 0 && sVar4 != 0) {
        memcpy(rd->noms,rd->noms + uVar6,sVar4 * 0x10);
      }
    }
    uVar3 = rd->curser;
    if (uVar3 < to_position) {
      mf_repdata_appendfactor(rd,uVar3,to_position);
      rd->curser = to_position;
      uVar3 = to_position;
    }
    if (uVar1 <= uVar3) {
      (rd->backlog).length = 0;
    }
  }
  return;
}

Assistant:

static void mf_repdata_do_replace 
    (MF_REPLACEMENT_DATA_t *rd, size_t to_position)
{
    unsigned int index;
    struct mf_replacement_nominee *nom;
    size_t base_position = rd->trie->base_position;
    
    if (to_position < base_position)
        return;
    
    /* Replace the candidate patterns */
    if (rd->noms_size > 0)
    {
        for (index = 0; index < rd->noms_size; index++)
        {
            nom = &rd->noms[index];
            
            if (to_position <= (nom->position - nom->pattern->ptext.length))
                break;
            
            /* Append the space before pattern */
            mf_repdata_appendfactor (rd, rd->curser, /* from */
                    nom->position - nom->pattern->ptext.length /* to */);
            
            /* Append the replacement instead of the pattern */
            mf_repdata_appendtext(rd, &nom->pattern->rtext);
            
            rd->curser = nom->position;
        }
        rd->noms_size -= index;
        
        /* Shift the array to the left to eliminate the consumed nominees */
        if (rd->noms_size && index)
        {
            memcpy (&rd->noms[0], &rd->noms[index], 
                    rd->noms_size * sizeof(struct mf_replacement_nominee));
            /* TODO: implement a circular queue */
        }
    }
    
    /* Append the chunk between the last pattern and to_position */
    if (to_position > rd->curser)
    {
        mf_repdata_appendfactor (rd, rd->curser, to_position);
        
        rd->curser = to_position;
    }
    
    if (base_position <= rd->curser)
    {
        /* we consume the whole backlog or none of it */
        rd->backlog.length = 0;
    }
}